

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flash.cpp
# Opt level: O0

void __thiscall
Flash::Flash(Flash *this,Samba *samba,string *name,uint32_t addr,uint32_t pages,uint32_t size,
            uint32_t planes,uint32_t lockRegions,uint32_t user,uint32_t stack)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t size_local;
  uint32_t pages_local;
  uint32_t addr_local;
  string *name_local;
  Samba *samba_local;
  Flash *this_local;
  
  this->_vptr_Flash = (_func_int **)&PTR__Flash_001280e0;
  this->_samba = samba;
  std::__cxx11::string::string((string *)&this->_name,(string *)name);
  this->_addr = addr;
  this->_pages = pages;
  this->_size = size;
  this->_planes = planes;
  this->_lockRegions = lockRegions;
  this->_user = user;
  WordCopyApplet::WordCopyApplet(&this->_wordCopy,samba,user);
  FlashOption<bool>::FlashOption(&this->_bootFlash);
  FlashOption<std::vector<bool,_std::allocator<bool>_>_>::FlashOption(&this->_regions);
  FlashOption<bool>::FlashOption(&this->_bod);
  FlashOption<bool>::FlashOption(&this->_bor);
  FlashOption<bool>::FlashOption(&this->_security);
  if ((size & size - 1) != 0) {
    __assert_fail("(size & (size - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/Flash.cpp"
                  ,0x2d,
                  "Flash::Flash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  if ((pages & pages - 1) == 0) {
    if ((lockRegions & lockRegions - 1) == 0) {
      WordCopyApplet::setWords(&this->_wordCopy,size >> 2);
      Applet::setStack(&(this->_wordCopy).super_Applet,stack);
      this->_onBufferA = true;
      uVar1 = this->_user;
      uVar2 = Applet::size(&(this->_wordCopy).super_Applet);
      this->_pageBufferA = uVar1 + uVar2 + 3 & 0xfffffffc;
      this->_pageBufferB = this->_pageBufferA + size;
      return;
    }
    __assert_fail("(lockRegions & (lockRegions - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/Flash.cpp"
                  ,0x2f,
                  "Flash::Flash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  __assert_fail("(pages & (pages - 1)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/Flash.cpp"
                ,0x2e,
                "Flash::Flash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
               );
}

Assistant:

Flash::Flash(Samba& samba,
             const std::string& name,
             uint32_t addr,
             uint32_t pages,
             uint32_t size,
             uint32_t planes,
             uint32_t lockRegions,
             uint32_t user,
             uint32_t stack)
    : _samba(samba), _name(name), _addr(addr), _pages(pages), _size(size),
      _planes(planes), _lockRegions(lockRegions), _user(user), _wordCopy(samba, user)
{
    assert((size & (size - 1)) == 0);
    assert((pages & (pages - 1)) == 0);
    assert((lockRegions & (lockRegions - 1)) == 0);
   
    _wordCopy.setWords(size / sizeof(uint32_t));
    
    _wordCopy.setStack(stack);

    _onBufferA = true;

    // page buffers will have the size of a physical page and will be situated right after the applet
    _pageBufferA = ((_user + _wordCopy.size() + 3) / 4) * 4; // we need to avoid non 32bits aligned access on Cortex-M0+
    _pageBufferB = _pageBufferA + size;
}